

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
          *solver,bit_array *x)

{
  uint uVar1;
  pointer ppVar2;
  bound_factor *pbVar3;
  pair<int,_int> pVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  pair<int,_int> pVar9;
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  *local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_40;
  sparse_matrix<int> *local_38;
  
  ppVar2 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  local_50._M_head_impl = (int *)&this->m_order;
  uVar1 = solver->m;
  local_38 = &solver->ap;
  local_48 = solver;
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )this;
  for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
    sparse_matrix<int>::row((sparse_matrix<int> *)&local_60,(int)local_38);
    pVar4 = local_60;
    iVar7 = 0;
    for (pVar9 = local_58; pVar9 != pVar4; pVar9 = (pair<int,_int>)((long)pVar9 + 8)) {
      iVar5 = bit_array::operator[](x,*(int *)((long)pVar9 + 4));
      iVar7 = iVar7 + iVar5;
    }
    pbVar3 = (local_48->b)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_false>
             ._M_head_impl;
    iVar5 = pbVar3[uVar8].min;
    uVar6 = iVar5 - iVar7;
    if ((uVar6 != 0 && iVar7 <= iVar5) ||
       (iVar5 = pbVar3[uVar8].max, uVar6 = iVar7 - iVar5, uVar6 != 0 && iVar5 <= iVar7)) {
      local_60 = (pair<int,_int>)((ulong)uVar6 << 0x20 | uVar8);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 local_50._M_head_impl,&local_60);
    }
  }
  return (int)((ulong)((long)*(pointer *)
                              ((long)local_40._M_t.
                                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                     .
                                     super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                     ._M_head_impl + 0x20) -
                      (long)(((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             ((long)local_40._M_t.
                                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                    .
                                    super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                    ._M_head_impl + 0x18))->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }